

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O0

void zzMulWMod(word *b,word *a,word w,word *mod,size_t n,void *stack)

{
  word wVar1;
  word in_RDX;
  word *in_RSI;
  size_t in_R8;
  word *in_R9;
  word *prod;
  
  wVar1 = zzMulW(in_R9,in_RSI,in_R8,in_RDX);
  in_R9[in_R8] = wVar1;
  zzMod(b,a,w,mod,n,stack);
  return;
}

Assistant:

void zzMulWMod(word b[], const word a[], register word w, const word mod[],
	size_t n, void* stack)
{
	word* prod = (word*)stack;
	stack = prod + n + 1;
	ASSERT(wwCmp(a, mod, n) < 0);
	ASSERT(wwIsValid(b, n));
	ASSERT(n > 0 && mod[n - 1] != 0);
	prod[n] = zzMulW(prod, a, n, w);
	zzMod(b, prod, n + 1, mod, n, stack);
}